

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerators::EndsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (str->_M_string_length < with->_M_string_length) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
    _Var1 = std::operator==(&local_30,with);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return _Var1;
}

Assistant:

bool cmQtAutoGenerators::EndsWith(const std::string& str,
                                  const std::string& with)
{
  if (with.length() > (str.length()))
    {
    return false;
    }
  return (str.substr(str.length() - with.length(), with.length()) == with);
}